

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

int ShFinalize(void)

{
  TSymbolTable *pTVar1;
  TPoolAllocator *pTVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  int stage;
  long lVar10;
  long lVar11;
  int pc;
  int p;
  long lVar12;
  bool bVar13;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::init_lock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  iVar3 = (anonymous_namespace)::NumberOfClients + -1;
  if (0 < (anonymous_namespace)::NumberOfClients) {
    bVar13 = (anonymous_namespace)::NumberOfClients == 1;
    (anonymous_namespace)::NumberOfClients = iVar3;
    if (bVar13) {
      puVar7 = &(anonymous_namespace)::SharedSymbolTables;
      lVar5 = 0;
      do {
        lVar4 = 0;
        puVar8 = puVar7;
        do {
          lVar12 = 0;
          puVar9 = puVar8;
          do {
            puVar6 = puVar9;
            lVar11 = 0;
            do {
              lVar10 = 0;
              do {
                pTVar1 = (TSymbolTable *)puVar6[lVar10];
                if (pTVar1 != (TSymbolTable *)0x0) {
                  glslang::TSymbolTable::~TSymbolTable(pTVar1);
                  operator_delete(pTVar1,0x28);
                }
                puVar6[lVar10] = 0;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 0xe);
              puVar6 = puVar6 + 0xe;
              bVar13 = lVar11 == 0;
              lVar11 = lVar11 + 1;
            } while (bVar13);
            lVar12 = lVar12 + 1;
            puVar9 = puVar9 + 0x1c;
          } while (lVar12 != 4);
          lVar4 = lVar4 + 1;
          puVar8 = puVar8 + 0x70;
        } while (lVar4 != 4);
        lVar5 = lVar5 + 1;
        puVar7 = puVar7 + 0x1c0;
      } while (lVar5 != 0x11);
      puVar7 = &(anonymous_namespace)::CommonSymbolTable;
      lVar5 = 0;
      do {
        lVar4 = 0;
        puVar8 = puVar7;
        do {
          lVar12 = 0;
          puVar9 = puVar8;
          do {
            puVar6 = puVar9;
            lVar11 = 0;
            do {
              lVar10 = 0;
              do {
                pTVar1 = (TSymbolTable *)puVar6[lVar10];
                if (pTVar1 != (TSymbolTable *)0x0) {
                  glslang::TSymbolTable::~TSymbolTable(pTVar1);
                  operator_delete(pTVar1,0x28);
                }
                puVar6[lVar10] = 0;
                pTVar2 = (anonymous_namespace)::PerProcessGPA;
                lVar10 = lVar10 + 1;
              } while (lVar10 == 1);
              puVar6 = puVar6 + 2;
              bVar13 = lVar11 == 0;
              lVar11 = lVar11 + 1;
            } while (bVar13);
            lVar12 = lVar12 + 1;
            puVar9 = puVar9 + 4;
          } while (lVar12 != 4);
          lVar4 = lVar4 + 1;
          puVar8 = puVar8 + 0x10;
        } while (lVar4 != 4);
        lVar5 = lVar5 + 1;
        puVar7 = puVar7 + 0x40;
      } while (lVar5 != 0x11);
      if ((anonymous_namespace)::PerProcessGPA != (TPoolAllocator *)0x0) {
        glslang::TPoolAllocator::~TPoolAllocator((anonymous_namespace)::PerProcessGPA);
        operator_delete(pTVar2,0x60);
        (anonymous_namespace)::PerProcessGPA = (TPoolAllocator *)0x0;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::init_lock);
    return 1;
  }
  (anonymous_namespace)::NumberOfClients = iVar3;
  __assert_fail("NumberOfClients >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ShaderLang.cpp"
                ,0x574,"int ShFinalize()");
}

Assistant:

int ShFinalize()
{
#ifndef DISABLE_THREAD_SUPPORT
    const std::lock_guard<std::mutex> lock(init_lock);
#endif
    --NumberOfClients;
    assert(NumberOfClients >= 0);
    if (NumberOfClients > 0)
        return 1;

    for (int version = 0; version < VersionCount; ++version) {
        for (int spvVersion = 0; spvVersion < SpvVersionCount; ++spvVersion) {
            for (int p = 0; p < ProfileCount; ++p) {
                for (int source = 0; source < SourceCount; ++source) {
                    for (int stage = 0; stage < EShLangCount; ++stage) {
                        delete SharedSymbolTables[version][spvVersion][p][source][stage];
                        SharedSymbolTables[version][spvVersion][p][source][stage] = nullptr;
                    }
                }
            }
        }
    }

    for (int version = 0; version < VersionCount; ++version) {
        for (int spvVersion = 0; spvVersion < SpvVersionCount; ++spvVersion) {
            for (int p = 0; p < ProfileCount; ++p) {
                for (int source = 0; source < SourceCount; ++source) {
                    for (int pc = 0; pc < EPcCount; ++pc) {
                        delete CommonSymbolTable[version][spvVersion][p][source][pc];
                        CommonSymbolTable[version][spvVersion][p][source][pc] = nullptr;
                    }
                }
            }
        }
    }

    if (PerProcessGPA != nullptr) {
        delete PerProcessGPA;
        PerProcessGPA = nullptr;
    }

    return 1;
}